

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::make_expression<mjs::this_expression>(parser *this)

{
  this_expression *this_00;
  long in_RSI;
  source_extend local_38;
  undefined1 local_19;
  parser *this_local;
  expression_ptr *e;
  
  this_local = this;
  if (*(long *)(in_RSI + 0x68) == 0) {
    __assert_fail("expression_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x13d,
                  "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::this_expression, Args = <>]"
                 );
  }
  local_19 = 0;
  this_00 = (this_expression *)operator_new(0x20);
  position_stack_node::extend(&local_38,*(position_stack_node **)(in_RSI + 0x68));
  this_expression::this_expression(this_00,&local_38);
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)this,
             (pointer)this_00);
  source_extend::~source_extend(&local_38);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }